

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicBuildSeparable::Run(BasicBuildSeparable *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  bool *compile_error;
  vec4 data;
  GLuint buffer;
  GLuint pipeline;
  char *cs [4];
  undefined8 local_78;
  undefined8 uStack_70;
  GLuint local_5c;
  GLuint local_58 [4];
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char *pcStack_30;
  
  local_38 = 
  "\nlayout(binding = 0, std430) buffer Output {\n  vec4 g_output;\n};\nvec4 CalculateOutput();\nvoid Run() {\n  g_output = CalculateOutput();\n}"
  ;
  pcStack_30 = "\nvec4 CalculateOutput() {\n  g_output = vec4(0);\n  return vec4(1, 2, 3, 4);\n}";
  local_48 = "#version 430 core";
  pcStack_40 = "\nlayout(local_size_x = 1) in;\nvoid Run();\nvoid main() {\n  Run();\n}";
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x91b9,4,&local_48);
  bVar1 = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,program,compile_error);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&local_5c);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,local_5c);
  local_78 = 0;
  uStack_70 = 0;
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_78,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  local_78 = 0;
  uStack_70 = 0;
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,local_5c);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x10,&local_78);
  if (((float)local_78 != 1.0) || (NAN((float)local_78))) {
LAB_0091bdbf:
    bVar1 = false;
    anon_unknown_0::Output("Invalid value!\n");
  }
  else {
    if ((local_78._4_4_ != 2.0) || (NAN(local_78._4_4_))) goto LAB_0091bdbf;
    if (((float)uStack_70 != 3.0) || (NAN((float)uStack_70))) goto LAB_0091bdbf;
    if ((uStack_70._4_4_ != 4.0) || (NAN(uStack_70._4_4_))) goto LAB_0091bdbf;
  }
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  glu::CallLogWrapper::glBufferSubData(this_00,0x90d2,0,0x10,local_58);
  glu::CallLogWrapper::glGenProgramPipelines(this_00,1,local_58);
  glu::CallLogWrapper::glUseProgramStages(this_00,local_58[0],0x20,program);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glBindProgramPipeline(this_00,local_58[0]);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x10,&local_78);
  if (((float)local_78 == 1.0) && (!NAN((float)local_78))) {
    if ((local_78._4_4_ == 2.0) && (!NAN(local_78._4_4_))) {
      if (((float)uStack_70 == 3.0) && (!NAN((float)uStack_70))) {
        if ((uStack_70._4_4_ == 4.0) && (!NAN(uStack_70._4_4_))) goto LAB_0091bebe;
      }
    }
  }
  bVar1 = false;
  anon_unknown_0::Output("Invalid value!\n");
LAB_0091bebe:
  glu::CallLogWrapper::glDeleteProgramPipelines(this_00,1,local_58);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&local_5c);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return (ulong)bVar1 - 1;
}

Assistant:

virtual long Run()
	{
		const char* const cs[4] = {
			"#version 430 core",

			NL "layout(local_size_x = 1) in;" NL "void Run();" NL "void main() {" NL "  Run();" NL "}",
			NL "layout(binding = 0, std430) buffer Output {" NL "  vec4 g_output;" NL "};" NL
			   "vec4 CalculateOutput();" NL "void Run() {" NL "  g_output = CalculateOutput();" NL "}",
			NL "vec4 CalculateOutput() {" NL "  g_output = vec4(0);" NL "  return vec4(1, 2, 3, 4);" NL "}"
		};

		const GLuint p   = glCreateShaderProgramv(GL_COMPUTE_SHADER, 4, cs);
		bool		 res = CheckProgram(p);

		GLuint buffer;
		glGenBuffers(1, &buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4), &vec4(0.0f)[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(p);
		glDispatchCompute(1, 1, 1);

		vec4 data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4), &data[0]);
		if (!IsEqual(data, vec4(1.0f, 2.0f, 3.0f, 4.0f)))
		{
			Output("Invalid value!\n");
			res = false;
		}

		glBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4), &vec4(0.0f)[0]);

		GLuint pipeline;
		glGenProgramPipelines(1, &pipeline);
		glUseProgramStages(pipeline, GL_COMPUTE_SHADER_BIT, p);

		glUseProgram(0);
		glBindProgramPipeline(pipeline);
		glDispatchCompute(1, 1, 1);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4), &data[0]);
		if (!IsEqual(data, vec4(1.0f, 2.0f, 3.0f, 4.0f)))
		{
			Output("Invalid value!\n");
			res = false;
		}

		glDeleteProgramPipelines(1, &pipeline);
		glDeleteBuffers(1, &buffer);
		glDeleteProgram(p);

		return res == true ? NO_ERROR : ERROR;
	}